

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intro.c
# Opt level: O2

int update(void)

{
  int iVar1;
  
  iVar1 = update_demo_menu(menu);
  if (iVar1 == 0x3e9) {
    iVar1 = 0;
  }
  else if (iVar1 == 1000) {
    iVar1 = 0xb;
  }
  return iVar1;
}

Assistant:

static int update(void)
{
   progress += 1.0f / logic_framerate;

   if (progress >= duration) {
      return DEMO_STATE_MAIN_MENU;
   }

   if (key_pressed(ALLEGRO_KEY_ESCAPE)) return DEMO_STATE_MAIN_MENU;
   if (key_pressed(ALLEGRO_KEY_SPACE)) return DEMO_STATE_MAIN_MENU;
   if (key_pressed(ALLEGRO_KEY_ENTER)) return DEMO_STATE_MAIN_MENU;
   if (mouse_button_pressed(1)) return DEMO_STATE_MAIN_MENU;

   return id();
}